

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O1

void __thiscall
LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2
          (LASreadItemCompressed_POINT10_v2 *this,ArithmeticDecoder *dec)

{
  undefined8 *puVar1;
  U8 *pUVar2;
  long lVar3;
  ArithmeticModel *pAVar4;
  IntegerCompressor *pIVar5;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015e748;
  this->last_item[0] = '\0';
  this->last_item[1] = '\0';
  this->last_item[2] = '\0';
  this->last_item[3] = '\0';
  this->last_item[4] = '\0';
  this->last_item[5] = '\0';
  this->last_item[6] = '\0';
  this->last_item[7] = '\0';
  this->last_item[8] = '\0';
  this->last_item[9] = '\0';
  this->last_item[10] = '\0';
  this->last_item[0xb] = '\0';
  this->last_item[0xc] = '\0';
  this->last_item[0xd] = '\0';
  this->last_item[0xe] = '\0';
  this->last_item[0xf] = '\0';
  this->last_item[0x10] = '\0';
  this->last_item[0x11] = '\0';
  this->last_item[0x12] = '\0';
  this->last_item[0x13] = '\0';
  this->last_intensity[0] = 0;
  this->last_intensity[1] = 0;
  this->last_intensity[2] = 0;
  this->last_intensity[3] = 0;
  this->last_intensity[4] = 0;
  this->last_intensity[5] = 0;
  this->last_intensity[6] = 0;
  this->last_intensity[7] = 0;
  this->last_intensity[8] = 0;
  this->last_intensity[9] = 0;
  this->last_intensity[10] = 0;
  this->last_intensity[0xb] = 0;
  this->last_intensity[0xc] = 0;
  this->last_intensity[0xd] = 0;
  this->last_intensity[0xe] = 0;
  this->last_intensity[0xf] = 0;
  lVar3 = 0x58;
  do {
    pUVar2 = this->last_item + lVar3 + -0x24;
    pUVar2[0] = '\0';
    pUVar2[1] = '\0';
    pUVar2[2] = '\0';
    pUVar2[3] = '\0';
    pUVar2[4] = '\0';
    pUVar2[5] = '\0';
    pUVar2[6] = '\0';
    pUVar2[7] = '\0';
    pUVar2[8] = '\0';
    pUVar2[9] = '\0';
    pUVar2[10] = '\0';
    pUVar2[0xb] = '\0';
    pUVar2[0xc] = '\0';
    pUVar2[0xd] = '\0';
    pUVar2[0xe] = '\0';
    pUVar2[0xf] = '\0';
    pUVar2 = this->last_item + lVar3 + -0x14;
    pUVar2[0] = '\0';
    pUVar2[1] = '\0';
    pUVar2[2] = '\0';
    pUVar2[3] = '\0';
    this->last_item[lVar3 + -0x10] = '\x01';
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x1d8);
  lVar3 = 0;
  do {
    puVar1 = (undefined8 *)((long)this->last_y_diff_median5[0].values + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)this->last_y_diff_median5[0].values + lVar3 + 0x10) = 0;
    *(undefined1 *)((long)this->last_y_diff_median5[0].values + lVar3 + 0x14) = 1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x180);
  this->last_height[4] = 0;
  this->last_height[5] = 0;
  this->last_height[6] = 0;
  this->last_height[7] = 0;
  this->last_height[0] = 0;
  this->last_height[1] = 0;
  this->last_height[2] = 0;
  this->last_height[3] = 0;
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    pAVar4 = ArithmeticDecoder::createSymbolModel(dec,0x40);
    this->m_changed_values = pAVar4;
    pIVar5 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar5,dec,0x10,4,8,0);
    this->ic_intensity = pIVar5;
    pAVar4 = ArithmeticDecoder::createSymbolModel(dec,0x100);
    this->m_scan_angle_rank[0] = pAVar4;
    pAVar4 = ArithmeticDecoder::createSymbolModel(dec,0x100);
    this->m_scan_angle_rank[1] = pAVar4;
    pIVar5 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar5,dec,0x10,1,8,0);
    this->ic_point_source_ID = pIVar5;
    memset(this->m_bit_byte,0,0x1800);
    pIVar5 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar5,dec,0x20,2,8,0);
    this->ic_dx = pIVar5;
    pIVar5 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar5,dec,0x20,0x16,8,0);
    this->ic_dy = pIVar5;
    pIVar5 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar5,dec,0x20,0x14,8,0);
    this->ic_z = pIVar5;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v2.cpp"
                ,0x3a,
                "LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_POINT10_v2::LASreadItemCompressed_POINT10_v2(ArithmeticDecoder* dec)
{
  U32 i;

  /* set decoder */
  assert(dec);
  this->dec = dec;

  /* create models and integer compressors */
  m_changed_values = dec->createSymbolModel(64);
  ic_intensity = new IntegerCompressor(dec, 16, 4);
  m_scan_angle_rank[0] = dec->createSymbolModel(256);
  m_scan_angle_rank[1] = dec->createSymbolModel(256);
  ic_point_source_ID = new IntegerCompressor(dec, 16);
  for (i = 0; i < 256; i++)
  {
    m_bit_byte[i] = 0;
    m_classification[i] = 0;
    m_user_data[i] = 0;
  }
  ic_dx = new IntegerCompressor(dec, 32, 2);  // 32 bits, 2 context
  ic_dy = new IntegerCompressor(dec, 32, 22); // 32 bits, 22 contexts
  ic_z = new IntegerCompressor(dec, 32, 20);  // 32 bits, 20 contexts
}